

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# licm_pass.cpp
# Opt level: O2

Status __thiscall spvtools::opt::LICMPass::ProcessLoop(LICMPass *this,Loop *loop,Function *f)

{
  Status SVar1;
  Status SVar2;
  size_t i;
  ulong uVar3;
  pointer ppLVar4;
  _Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> local_48;
  
  SVar2 = SuccessWithoutChange;
  for (ppLVar4 = (loop->nested_loops_).
                 super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      (SVar2 != Failure &&
      (ppLVar4 !=
       (loop->nested_loops_).
       super__Vector_base<spvtools::opt::Loop_*,_std::allocator<spvtools::opt::Loop_*>_>._M_impl.
       super__Vector_impl_data._M_finish)); ppLVar4 = ppLVar4 + 1) {
    SVar1 = ProcessLoop(this,*ppLVar4,f);
    if ((int)SVar1 < (int)SVar2) {
      SVar2 = SVar1;
    }
  }
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SVar1 = AnalyseAndHoistFromBB
                    (this,loop,f,loop->loop_header_,
                     (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                      *)&local_48);
  if ((int)SVar1 < (int)SVar2) {
    SVar2 = SVar1;
  }
  for (uVar3 = 0;
      (SVar2 != Failure &&
      (uVar3 < (ulong)((long)local_48._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_48._M_impl.super__Vector_impl_data._M_start >> 3)));
      uVar3 = uVar3 + 1) {
    SVar1 = AnalyseAndHoistFromBB
                      (this,loop,f,local_48._M_impl.super__Vector_impl_data._M_start[uVar3],
                       (vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
                        *)&local_48);
    if ((int)SVar1 < (int)SVar2) {
      SVar2 = SVar1;
    }
  }
  std::_Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
  ~_Vector_base(&local_48);
  return SVar2;
}

Assistant:

Pass::Status LICMPass::ProcessLoop(Loop* loop, Function* f) {
  Status status = Status::SuccessWithoutChange;

  // Process all nested loops first
  for (auto nl = loop->begin(); nl != loop->end() && status != Status::Failure;
       ++nl) {
    Loop* nested_loop = *nl;
    status = CombineStatus(status, ProcessLoop(nested_loop, f));
  }

  std::vector<BasicBlock*> loop_bbs{};
  status = CombineStatus(
      status,
      AnalyseAndHoistFromBB(loop, f, loop->GetHeaderBlock(), &loop_bbs));

  for (size_t i = 0; i < loop_bbs.size() && status != Status::Failure; ++i) {
    BasicBlock* bb = loop_bbs[i];
    // do not delete the element
    status =
        CombineStatus(status, AnalyseAndHoistFromBB(loop, f, bb, &loop_bbs));
  }

  return status;
}